

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

size_t __thiscall google::protobuf::FieldDescriptorProto::ByteSizeLong(FieldDescriptorProto *this)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  ulong uVar6;
  size_t sVar7;
  
  uVar1 = *(uint *)&this->field_0;
  sVar7 = (ulong)(uVar1 >> 8 & 1) * 3;
  if ((char)uVar1 != '\0') {
    if ((uVar1 & 1) != 0) {
      lVar2 = *(long *)(((ulong)(this->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc)
                       + 8);
      uVar4 = (uint)lVar2 | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar7 = sVar7 + lVar2 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar1 & 2) != 0) {
      lVar2 = *(long *)(((ulong)(this->field_0)._impl_.extendee_.tagged_ptr_.ptr_ &
                        0xfffffffffffffffc) + 8);
      uVar4 = (uint)lVar2 | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar7 = sVar7 + lVar2 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar1 & 4) != 0) {
      lVar2 = *(long *)(((ulong)(this->field_0)._impl_.type_name_.tagged_ptr_.ptr_ &
                        0xfffffffffffffffc) + 8);
      uVar4 = (uint)lVar2 | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar7 = sVar7 + lVar2 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar1 & 8) != 0) {
      lVar2 = *(long *)(((ulong)(this->field_0)._impl_.default_value_.tagged_ptr_.ptr_ &
                        0xfffffffffffffffc) + 8);
      uVar4 = (uint)lVar2 | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar7 = sVar7 + lVar2 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar1 & 0x10) != 0) {
      lVar2 = *(long *)(((ulong)(this->field_0)._impl_.json_name_.tagged_ptr_.ptr_ &
                        0xfffffffffffffffc) + 8);
      uVar4 = (uint)lVar2 | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar7 = sVar7 + lVar2 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar1 & 0x20) != 0) {
      sVar5 = FieldOptions::ByteSizeLong((this->field_0)._impl_.options_);
      uVar4 = (uint)sVar5 | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar7 = sVar7 + sVar5 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar1 & 0x40) != 0) {
      uVar6 = (long)(this->field_0)._impl_.number_ | 1;
      lVar2 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar7 = sVar7 + ((int)lVar2 * 9 + 0x89U >> 6);
    }
    if ((char)uVar1 < '\0') {
      uVar6 = (long)(this->field_0)._impl_.oneof_index_ | 1;
      lVar2 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar7 = sVar7 + ((int)lVar2 * 9 + 0x89U >> 6);
    }
  }
  if ((uVar1 & 0x600) != 0) {
    if ((uVar1 >> 9 & 1) != 0) {
      uVar6 = (long)(this->field_0)._impl_.label_ | 1;
      lVar2 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar7 = sVar7 + ((int)lVar2 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar1 >> 10 & 1) != 0) {
      uVar6 = (long)(this->field_0)._impl_.type_ | 1;
      lVar2 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar7 = sVar7 + ((int)lVar2 * 9 + 0x49U >> 6) + 1;
    }
  }
  sVar7 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar7,&(this->field_0)._impl_._cached_size_);
  return sVar7;
}

Assistant:

::size_t FieldDescriptorProto::ByteSizeLong() const {
  const FieldDescriptorProto& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.FieldDescriptorProto)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
  cached_has_bits = this_._impl_._has_bits_[0];
  total_size += static_cast<bool>(0x00000100u & cached_has_bits) * 3;
  if ((cached_has_bits & 0x000000ffu) != 0) {
    // optional string name = 1;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_name());
    }
    // optional string extendee = 2;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_extendee());
    }
    // optional string type_name = 6;
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_type_name());
    }
    // optional string default_value = 7;
    if ((cached_has_bits & 0x00000008u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_default_value());
    }
    // optional string json_name = 10;
    if ((cached_has_bits & 0x00000010u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_json_name());
    }
    // optional .google.protobuf.FieldOptions options = 8;
    if ((cached_has_bits & 0x00000020u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.options_);
    }
    // optional int32 number = 3;
    if ((cached_has_bits & 0x00000040u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_number());
    }
    // optional int32 oneof_index = 9;
    if ((cached_has_bits & 0x00000080u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_oneof_index());
    }
  }
  if ((cached_has_bits & 0x00000600u) != 0) {
    // optional .google.protobuf.FieldDescriptorProto.Label label = 4;
    if ((cached_has_bits & 0x00000200u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_label());
    }
    // optional .google.protobuf.FieldDescriptorProto.Type type = 5;
    if ((cached_has_bits & 0x00000400u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_type());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}